

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

int __thiscall
capnp::_::anon_unknown_0::TestVat::connect(TestVat *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  TestNetwork *pTVar1;
  bool bVar2;
  TestVat **ppTVar3;
  ConnectionImpl *this_00;
  RefOrVoid<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl> other;
  ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  *this_01;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> *pOVar4;
  undefined4 in_register_00000034;
  TestVat *params;
  StringPtr name;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_110;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_100;
  undefined1 local_f0 [8];
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> remote;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> local;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_c0;
  ConnectionImpl **local_b0;
  ConnectionImpl **conn;
  Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*&> local_a0;
  ConnectionImpl **local_98;
  ConnectionImpl **_conn586;
  TestVat *pTStack_88;
  bool unique;
  Fault local_70;
  ArrayPtr<const_char> local_68;
  char *local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [16];
  TestVat *_kj_result;
  TestVat *dst;
  undefined1 local_28 [16];
  undefined8 local_18;
  TestVat *this_local;
  
  params = (TestVat *)CONCAT44(in_register_00000034,__fd);
  local_18 = params;
  this_local = this;
  local_28 = (undefined1  [16])
             capnproto_test::capnp::test::TestSturdyRefHostId::Reader::getHost
                       ((Reader *)&stack0x00000008);
  bVar2 = kj::StringPtr::operator==((StringPtr *)&stack0xffffffffffffffd8,&params->self);
  if (bVar2) {
    kj::
    Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
    ::Maybe((Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
             *)this);
  }
  else {
    pTVar1 = params->network;
    local_68 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestSturdyRefHostId::Reader::getHost
                         ((Reader *)&stack0x00000008);
    local_58 = local_68.ptr;
    local_50 = (undefined1  [8])local_68.size_;
    name.content.size_ = (size_t)local_68.ptr;
    name.content.ptr = (char *)pTVar1;
    TestNetwork::find((TestNetwork *)local_48,name);
    local_48._8_8_ =
         kj::_::readMaybe<capnp::_::(anonymous_namespace)::TestVat>
                   ((Maybe<capnp::_::(anonymous_namespace)::TestVat_&> *)local_48);
    if ((TestVat *)local_48._8_8_ == (TestVat *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x246,FAILED,"network.find(hostId.getHost()) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    ppTVar3 = kj::mv<capnp::_::(anonymous_namespace)::TestVat*>((TestVat **)(local_48 + 8));
    pTStack_88 = *ppTVar3;
    _kj_result = pTStack_88;
    _conn586._7_1_ =
         capnproto_test::capnp::test::TestSturdyRefHostId::Reader::getUnique
                   ((Reader *)&stack0x00000008);
    if (!(bool)_conn586._7_1_) {
      conn = (ConnectionImpl **)_kj_result;
      kj::
      HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
      ::find<capnp::_::(anonymous_namespace)::TestVat*>
                ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                  *)&local_a0,(TestVat **)&params->connections);
      local_b0 = kj::_::readMaybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                           (&local_a0);
      if (local_b0 != (ConnectionImpl **)0x0) {
        local_98 = local_b0;
        kj::addRef<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl>
                  ((kj *)&local.ptr,*local_b0);
        kj::
        Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
        ::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,void>
                  ((Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
                    *)&local_c0,
                   (Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> *)
                   &local.ptr);
        kj::
        Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
        ::Maybe((Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
                 *)this,&local_c0);
        kj::
        Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
        ::~Own(&local_c0);
        kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::~Own
                  ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> *)
                   &local.ptr);
        goto LAB_0029d443;
      }
      local_98._0_4_ = 0;
      local_98._4_4_ = 0;
    }
    kj::
    refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
              ((kj *)&remote.ptr,params,_kj_result,&params->self,(bool *)((long)&_conn586 + 7));
    kj::
    refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
              ((kj *)local_f0,_kj_result,params,&_kj_result->self,(bool *)((long)&_conn586 + 7));
    this_00 = kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::
              operator->((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>
                          *)&remote.ptr);
    other = kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::
            operator*((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>
                       *)local_f0);
    ConnectionImpl::attach(this_00,other);
    this_01 = &_kj_result->acceptQueue;
    pOVar4 = kj::
             mv<kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,decltype(nullptr)>>
                       ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>
                         *)local_f0);
    kj::
    Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
    ::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,void>
              ((Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
                *)&local_100,pOVar4);
    kj::
    ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
    ::push(this_01,&local_100);
    kj::
    Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
    ::~Own(&local_100);
    pOVar4 = kj::
             mv<kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,decltype(nullptr)>>
                       ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>
                         *)&remote.ptr);
    kj::
    Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
    ::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,void>
              ((Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>::Connection,decltype(nullptr)>
                *)&local_110,pOVar4);
    kj::
    Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
    ::Maybe((Maybe<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
             *)this,&local_110);
    kj::
    Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
    ::~Own(&local_110);
    kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::~Own
              ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> *)
               local_f0);
    kj::Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t>::~Own
              ((Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> *)
               &remote.ptr);
  }
LAB_0029d443:
  return (int)this;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connect(test::TestSturdyRefHostId::Reader hostId) override {
    if (hostId.getHost() == self) {
      return kj::none;
    }

    TestVat& dst = KJ_REQUIRE_NONNULL(network.find(hostId.getHost()));

    bool unique = hostId.getUnique();
    if (!unique) {
      KJ_IF_SOME(conn, connections.find(&dst)) {
        // Return existing connection.
        return kj::Own<Connection>(kj::addRef(*conn));
      }
    }

    // Create new connection.
    auto local = kj::refcounted<ConnectionImpl>(*this, dst, self, unique);
    auto remote = kj::refcounted<ConnectionImpl>(dst, *this, dst.self, unique);
    local->attach(*remote);

    dst.acceptQueue.push(kj::mv(remote));
    return kj::Own<Connection>(kj::mv(local));
  }